

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O1

char * json_object_to_json_string_length(json_object *jso,int flags,size_t *length)

{
  int iVar1;
  printbuf *ppVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (jso == (json_object *)0x0) {
    sVar3 = 4;
    pcVar4 = "null";
    goto LAB_00105212;
  }
  if (jso->_pb == (printbuf *)0x0) {
    ppVar2 = printbuf_new();
    jso->_pb = ppVar2;
    if (ppVar2 != (printbuf *)0x0) goto LAB_001051d3;
  }
  else {
LAB_001051d3:
    printbuf_reset(jso->_pb);
    iVar1 = (*jso->_to_json_string)(jso,jso->_pb,0,flags);
    if (-1 < iVar1) {
      sVar3 = (size_t)jso->_pb->bpos;
      pcVar4 = jso->_pb->buf;
      goto LAB_00105212;
    }
  }
  pcVar4 = (char *)0x0;
  sVar3 = 0;
LAB_00105212:
  if (length != (size_t *)0x0) {
    *length = sVar3;
  }
  return pcVar4;
}

Assistant:

const char *json_object_to_json_string_length(struct json_object *jso, int flags, size_t *length)
{
	const char *r = NULL;
	size_t s = 0;

	if (!jso)
	{
		s = 4;
		r = "null";
	}
	else if ((jso->_pb) || (jso->_pb = printbuf_new()))
	{
		printbuf_reset(jso->_pb);

		if (jso->_to_json_string(jso, jso->_pb, 0, flags) >= 0)
		{
			s = (size_t)jso->_pb->bpos;
			r = jso->_pb->buf;
		}
	}

	if (length)
		*length = s;
	return r;
}